

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmsgs.cc
# Opt level: O2

string * encodeCompactNodeId_abi_cxx11_(string *__return_storage_ptr__,bdId *id)

{
  long lVar1;
  string sStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (lVar1 = 0x10; lVar1 != 0x24; lVar1 = lVar1 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  encodeCompactPeerId_abi_cxx11_(&sStack_38,&id->addr);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string encodeCompactNodeId(bdId *id) {
	std::string enc;
	for (int i = 0; i < BITDHT_KEY_LEN; i++) {
		enc += id->id.data[i];
	}
	/* convert ip address (already in network order) */
	enc += encodeCompactPeerId(&(id->addr));
	return enc;
}